

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompress_template.h
# Opt level: O1

libdeflate_result
deflate_decompress_bmi2
          (libdeflate_decompressor *d,void *in,size_t in_nbytes,void *out,size_t out_nbytes_avail,
          size_t *actual_in_nbytes_ret,size_t *actual_out_nbytes_ret)

{
  ushort *puVar1;
  u32 *decode_table;
  u16 *sorted_syms;
  undefined8 *puVar2;
  long *plVar3;
  ushort *puVar4;
  u8 uVar5;
  undefined8 uVar6;
  sbyte sVar7;
  bool bVar8;
  ushort uVar9;
  _Bool _Var10;
  uint uVar11;
  size_t sVar12;
  size_t sVar13;
  ulong uVar14;
  ulong uVar15;
  byte bVar16;
  ulong uVar17;
  long *plVar18;
  ushort *__src;
  ulong uVar19;
  long *plVar20;
  long lVar21;
  libdeflate_result lVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  int iVar29;
  char cVar30;
  libdeflate_result local_d4;
  ulong local_d0;
  ulong local_b0;
  undefined8 *local_a8;
  undefined8 *local_90;
  
  plVar3 = (long *)((long)out + out_nbytes_avail);
  sVar12 = 299;
  if (out_nbytes_avail < 299) {
    sVar12 = out_nbytes_avail;
  }
  puVar4 = (ushort *)((long)in + in_nbytes);
  sVar13 = 0x19;
  if (in_nbytes < 0x19) {
    sVar13 = in_nbytes;
  }
  decode_table = (d->u).l.precode_decode_table;
  sorted_syms = d->sorted_syms;
  puVar2 = (undefined8 *)((long)&d->u + 0x120);
  local_d0 = 0;
  uVar26 = 0;
  uVar14 = 0;
  plVar18 = (long *)out;
  __src = (ushort *)in;
  local_a8 = puVar2;
  local_90 = puVar2;
  do {
    if ((ulong)((long)puVar4 - (long)__src) < 8) {
      uVar27 = uVar26 & 0xff;
      uVar24 = (uint)uVar27;
      while (uVar23 = (uint)uVar26, uVar24 < 0x38) {
        if (__src == puVar4) {
          local_d0 = local_d0 + 1;
          if (8 < local_d0) goto LAB_00109d38;
        }
        else {
          uVar9 = *__src;
          __src = (ushort *)((long)__src + 1);
          uVar14 = uVar14 | (ulong)(byte)uVar9 << (uVar27 & 0x3f);
        }
        uVar26 = (ulong)(uVar23 + 8);
        uVar27 = uVar26 & 0xff;
        uVar24 = (uint)uVar27;
      }
      iVar29 = 1;
      uVar27 = uVar14;
      lVar22 = LIBDEFLATE_BAD_DATA;
      local_b0 = uVar14;
      switch((uint)(uVar14 >> 1) & 3) {
      case 1:
        goto switchD_0010902c_caseD_1;
      case 2:
        goto switchD_0010902c_caseD_2;
      case 3:
        goto switchD_0010902c_caseD_3;
      }
switchD_0010902c_caseD_0:
      lVar22 = LIBDEFLATE_BAD_DATA;
      uVar24 = uVar23 + 0xfd & 0xff;
      uVar26 = (ulong)uVar24;
      uVar14 = (ulong)(uVar24 >> 3);
      lVar21 = local_d0 - uVar14;
      if (local_d0 < uVar14 || lVar21 == 0) {
        __src = (ushort *)((long)__src + lVar21);
        if (3 < (long)puVar4 - (long)__src) {
          uVar9 = *__src;
          uVar14 = (ulong)uVar9;
          puVar1 = __src + 1;
          __src = __src + 2;
          if ((*puVar1 ^ uVar9) == 0xffff) {
            if ((long)plVar3 - (long)plVar18 < (long)uVar14) {
              lVar22 = LIBDEFLATE_INSUFFICIENT_SPACE;
            }
            else if ((long)uVar14 <= (long)puVar4 - (long)__src) {
              memcpy(plVar18,__src,uVar14);
              __src = (ushort *)((long)__src + uVar14);
              plVar18 = (long *)((long)plVar18 + uVar14);
              local_d0 = 0;
              bVar8 = true;
              uVar26 = 0;
              uVar14 = 0;
              lVar22 = local_d4;
              goto LAB_001090d0;
            }
          }
        }
        local_d0 = 0;
        bVar8 = false;
        uVar26 = 0;
        uVar14 = 0;
      }
      else {
        bVar8 = false;
        uVar14 = local_b0;
      }
LAB_001090d0:
      if (!bVar8) {
        return lVar22;
      }
    }
    else {
      uVar27 = *(long *)__src << (uVar26 & 0x3f) | uVar14;
      __src = (ushort *)((long)__src + (7 - (ulong)((uint)(uVar26 >> 3) & 7)));
      uVar23 = (uint)uVar26 | 0x38;
      uVar26 = (ulong)uVar23;
      iVar29 = 1;
      uVar14 = uVar27 & 0xffffffff;
      lVar22 = LIBDEFLATE_BAD_DATA;
      local_b0 = uVar27;
      switch((uint)(uVar27 >> 1) & 3) {
      case 0:
        goto switchD_0010902c_caseD_0;
      case 1:
switchD_0010902c_caseD_1:
        uVar27 = local_b0 >> 3;
        uVar26 = (ulong)(uVar23 - 3);
        iVar29 = 0x1d;
        lVar22 = local_d4;
        if (d->static_codes_loaded == false) {
          d->static_codes_loaded = true;
          memset(d,8,0x90);
          *(undefined8 *)((long)&d->u + 0x90) = 0x909090909090909;
          *(undefined8 *)((long)&d->u + 0x98) = 0x909090909090909;
          *(undefined8 *)((long)&d->u + 0xa0) = 0x909090909090909;
          *(undefined8 *)((long)&d->u + 0xa8) = 0x909090909090909;
          *(undefined8 *)((long)&d->u + 0xb0) = 0x909090909090909;
          *(undefined8 *)((long)&d->u + 0xb8) = 0x909090909090909;
          *(undefined8 *)((long)&d->u + 0xc0) = 0x909090909090909;
          *(undefined8 *)((long)&d->u + 200) = 0x909090909090909;
          *(undefined8 *)((long)&d->u + 0xd0) = 0x909090909090909;
          *(undefined8 *)((long)&d->u + 0xd8) = 0x909090909090909;
          *(undefined8 *)((long)&d->u + 0xe0) = 0x909090909090909;
          *(undefined8 *)((long)&d->u + 0xe8) = 0x909090909090909;
          *(undefined8 *)((long)&d->u + 0xf0) = 0x909090909090909;
          *(undefined8 *)((long)&d->u + 0xf8) = 0x909090909090909;
          *(undefined8 *)((long)&d->u + 0x100) = 0x707070707070707;
          *(undefined8 *)((long)&d->u + 0x108) = 0x707070707070707;
          *(undefined8 *)((long)&d->u + 0x110) = 0x707070707070707;
          *(undefined8 *)((long)&d->u + 0x118) = 0x808080808080808;
          *(undefined8 *)((long)&d->u + 0x130) = 0x505050505050505;
          *(undefined8 *)((long)&d->u + 0x138) = 0x505050505050505;
          *puVar2 = 0x505050505050505;
          *(undefined8 *)((long)&d->u + 0x128) = 0x505050505050505;
          iVar29 = 0;
          local_a8 = (undefined8 *)0x20;
          local_90 = (undefined8 *)0x120;
        }
        break;
      case 2:
switchD_0010902c_caseD_2:
        uVar25 = ((uint)(uVar14 >> 3) & 0x1f) + 0x101;
        local_90 = (undefined8 *)(ulong)uVar25;
        uVar24 = ((uint)(uVar14 >> 8) & 0x1f) + 1;
        local_a8 = (undefined8 *)(ulong)uVar24;
        d->static_codes_loaded = false;
        (d->u).precode_lens[0x10] = (byte)(local_b0 >> 0x11) & 7;
        uVar27 = local_b0 >> 0x14;
        uVar23 = uVar23 - 0x14;
        uVar26 = (ulong)uVar23;
        if ((ulong)((long)puVar4 - (long)__src) < 8) {
          uVar15 = uVar26 & 0xff;
          uVar11 = (uint)uVar15;
          while (uVar11 < 0x38) {
            if (__src == puVar4) {
              local_d0 = local_d0 + 1;
              if (8 < local_d0) goto LAB_00109c8f;
            }
            else {
              uVar9 = *__src;
              __src = (ushort *)((long)__src + 1);
              uVar27 = uVar27 | (ulong)(byte)uVar9 << (uVar15 & 0x3f);
            }
            uVar23 = (int)uVar26 + 8;
            uVar26 = (ulong)uVar23;
            uVar15 = uVar26 & 0xff;
            uVar11 = (uint)uVar15;
          }
        }
        else {
          uVar27 = uVar27 | *(long *)__src << (uVar26 & 0x3f);
          __src = (ushort *)((long)__src + (7 - (ulong)(uVar23 >> 3 & 7)));
          uVar23 = uVar23 | 0x38;
        }
        uVar11 = (uint)uVar14 >> 0xd & 0xf;
        uVar14 = 0;
        uVar26 = 1;
        do {
          uVar15 = uVar26;
          (d->u).precode_lens["\x10\x11\x12"[uVar14 + 1]] = (byte)uVar27 & 7;
          uVar27 = uVar27 >> 3;
          uVar14 = uVar14 + 1;
          uVar26 = uVar15 + 1;
        } while ((ulong)uVar11 + 3 != uVar14);
        while (uVar14 < 0x12) {
          (d->u).precode_lens["\x10\x11\x12"[uVar15 + 1]] = '\0';
          uVar15 = uVar15 + 1;
          uVar14 = uVar15;
        }
        uVar26 = (ulong)((uVar23 + uVar11 * -3) - 9);
        _Var10 = build_decode_table(decode_table,(u8 *)d,0x13,precode_decode_results,7,7,sorted_syms
                                    ,(uint *)0x0);
        if (_Var10) {
          uVar25 = uVar25 + uVar24;
          uVar14 = 0;
          do {
            uVar24 = (uint)uVar26;
            if ((uVar24 & 0xff) < 0xe) {
              if ((ulong)((long)puVar4 - (long)__src) < 8) {
                uVar15 = uVar26 & 0xff;
                uVar23 = (uint)uVar15;
                while (uVar23 < 0x38) {
                  if (__src == puVar4) {
                    local_d0 = local_d0 + 1;
                    if (8 < local_d0) {
                      cVar30 = '\x01';
                      local_d4 = LIBDEFLATE_BAD_DATA;
                      goto LAB_001093e7;
                    }
                  }
                  else {
                    uVar9 = *__src;
                    __src = (ushort *)((long)__src + 1);
                    uVar27 = uVar27 | (ulong)(byte)uVar9 << (uVar15 & 0x3f);
                  }
                  uVar24 = (int)uVar26 + 8;
                  uVar26 = (ulong)uVar24;
                  uVar15 = uVar26 & 0xff;
                  uVar23 = (uint)uVar15;
                }
              }
              else {
                uVar27 = uVar27 | *(long *)__src << (uVar26 & 0x3f);
                __src = (ushort *)((long)__src + (7 - (ulong)((uint)(uVar26 >> 3) & 7)));
                uVar24 = uVar24 | 0x38;
              }
            }
            uVar23 = decode_table[(uint)uVar27 & 0x7f];
            uVar27 = uVar27 >> ((ulong)uVar23 & 0x3f);
            uVar24 = uVar24 - uVar23;
            uVar26 = (ulong)uVar24;
            iVar29 = (int)uVar14;
            if (uVar23 < 0x100000) {
              (d->u).precode_lens[uVar14] = (u8)(uVar23 >> 0x10);
              cVar30 = '\x15';
              uVar14 = (ulong)(iVar29 + 1);
            }
            else {
              uVar11 = (uint)uVar27;
              if (uVar23 >> 0x10 == 0x11) {
                uVar23 = (uVar11 & 7) + 3;
                uVar27 = uVar27 >> 3;
                uVar26 = (ulong)(uVar24 - 3);
                (d->u).precode_lens[uVar14] = '\0';
                (d->u).precode_lens[iVar29 + 1] = '\0';
                (d->u).precode_lens[iVar29 + 2] = '\0';
                (d->u).precode_lens[iVar29 + 3] = '\0';
                (d->u).precode_lens[iVar29 + 4] = '\0';
                (d->u).precode_lens[iVar29 + 5] = '\0';
                (d->u).precode_lens[iVar29 + 6] = '\0';
                (d->u).precode_lens[iVar29 + 7] = '\0';
                (d->u).precode_lens[iVar29 + 8] = '\0';
                (d->u).precode_lens[iVar29 + 9] = '\0';
              }
              else if (uVar23 >> 0x10 == 0x10) {
                if (iVar29 == 0) {
                  cVar30 = '\x01';
                  local_d4 = LIBDEFLATE_BAD_DATA;
                  goto LAB_001093e7;
                }
                uVar5 = (d->u).precode_lens[iVar29 - 1];
                uVar23 = (uVar11 & 3) + 3;
                uVar27 = uVar27 >> 2;
                uVar26 = (ulong)(uVar24 - 2);
                (d->u).precode_lens[uVar14] = uVar5;
                (d->u).precode_lens[iVar29 + 1] = uVar5;
                (d->u).precode_lens[iVar29 + 2] = uVar5;
                (d->u).precode_lens[iVar29 + 3] = uVar5;
                (d->u).precode_lens[iVar29 + 4] = uVar5;
                (d->u).precode_lens[iVar29 + 5] = uVar5;
              }
              else {
                uVar23 = (uVar11 & 0x7f) + 0xb;
                uVar27 = uVar27 >> 7;
                uVar26 = (ulong)(uVar24 - 7);
                memset((void *)((long)&d->u + uVar14),0,(ulong)uVar23);
              }
              uVar14 = (ulong)(iVar29 + uVar23);
              cVar30 = '\0';
            }
LAB_001093e7:
            if ((cVar30 != '\x15') && (cVar30 != '\0')) goto LAB_00109584;
            cVar30 = (uint)uVar14 != uVar25;
          } while ((uint)uVar14 < uVar25);
          if ((bool)cVar30) {
            local_d4 = LIBDEFLATE_BAD_DATA;
          }
        }
        else {
LAB_00109c8f:
          cVar30 = '\x01';
          local_d4 = LIBDEFLATE_BAD_DATA;
        }
LAB_00109584:
        if (cVar30 != '\0') {
          return local_d4;
        }
        goto LAB_0010958c;
      }
switchD_0010902c_caseD_3:
      local_d4 = lVar22;
      if (iVar29 != 0x1d) {
        if (iVar29 != 0) {
          return local_d4;
        }
LAB_0010958c:
        _Var10 = build_decode_table(d->offset_decode_table,
                                    (d->u).precode_lens + ((ulong)local_90 & 0xffffffff),
                                    (uint)local_a8,offset_decode_results,8,0xf,sorted_syms,
                                    (uint *)0x0);
        if (!_Var10) goto LAB_00109d38;
        _Var10 = build_decode_table((u32 *)d,(u8 *)d,(uint)local_90,litlen_decode_results,0xb,0xf,
                                    sorted_syms,&d->litlen_tablebits);
        if (!_Var10) {
          return LIBDEFLATE_BAD_DATA;
        }
      }
      uVar15 = ~(-1L << ((ulong)(byte)d->litlen_tablebits & 0x3f));
      if ((__src < (ushort *)((long)puVar4 - sVar13)) && (plVar18 < (long *)((long)plVar3 - sVar12))
         ) {
        uVar14 = uVar27 | *(long *)__src << (uVar26 & 0x3f);
        __src = (ushort *)((long)__src + (7 - (ulong)((uint)(uVar26 >> 3) & 7)));
        uVar26 = (ulong)((uint)uVar26 | 0x38);
        uVar17 = (ulong)(d->u).litlen_decode_table[uVar14 & uVar15];
        do {
          uVar19 = uVar14 >> (uVar17 & 0x3f);
          uVar24 = (int)uVar26 - (int)uVar17;
          uVar26 = (ulong)uVar24;
          uVar27 = uVar19;
          if ((int)uVar17 < 0) {
            *(char *)plVar18 = (char)(uVar17 >> 0x10);
            uVar23 = (d->u).litlen_decode_table[uVar19 & uVar15];
            uVar17 = (ulong)uVar23;
            uVar14 = uVar19 >> (uVar17 & 0x3f);
            uVar24 = uVar24 - uVar23;
            uVar26 = (ulong)uVar24;
            if (-1 < (int)uVar23) {
              plVar18 = (long *)((long)plVar18 + 1);
              uVar27 = uVar14;
              uVar14 = uVar19;
              goto LAB_001096bb;
            }
            *(char *)((long)plVar18 + 1) = (char)(uVar23 >> 0x10);
            uVar23 = (d->u).litlen_decode_table[uVar14 & uVar15];
            uVar17 = (ulong)uVar23;
            uVar27 = uVar14 >> (uVar17 & 0x3f);
            uVar24 = uVar24 - uVar23;
            uVar26 = (ulong)uVar24;
            if (-1 < (int)uVar23) {
              plVar18 = (long *)((long)plVar18 + 2);
              goto LAB_001096bb;
            }
            *(char *)((long)plVar18 + 2) = (char)(uVar23 >> 0x10);
            uVar17 = (ulong)(d->u).litlen_decode_table[uVar27 & uVar15];
            uVar27 = *(long *)__src << (uVar26 & 0x3f) | uVar27;
            __src = (ushort *)((long)__src + (7 - (ulong)(uVar24 >> 3 & 7)));
            uVar26 = (ulong)(uVar24 | 0x38);
            iVar29 = 0x33;
            plVar18 = (long *)((long)plVar18 + 3);
          }
          else {
LAB_001096bb:
            uVar19 = uVar17;
            if ((short)uVar17 < 0) {
              iVar29 = 0x1c;
              if (((uint)uVar17 >> 0xd & 1) == 0) {
                bVar16 = (byte)(uVar17 >> 8) & 0x1f;
                sVar7 = (bVar16 < 0x21) * (' ' - bVar16);
                uVar24 = (d->u).litlen_decode_table
                         [(ulong)((uint)((int)uVar27 << sVar7) >> sVar7) + (uVar17 >> 0x10)];
                uVar28 = uVar27 >> ((ulong)uVar24 & 0x3f);
                uVar23 = (int)uVar26 - uVar24;
                uVar26 = (ulong)uVar23;
                if ((int)uVar24 < 0) {
                  uVar17 = (ulong)(d->u).litlen_decode_table[uVar28 & uVar15];
                  uVar27 = uVar28 | *(long *)__src << (uVar26 & 0x3f);
                  __src = (ushort *)((long)__src + (7 - (ulong)(uVar23 >> 3 & 7)));
                  uVar26 = (ulong)(uVar23 | 0x38);
                  *(char *)plVar18 = (char)(uVar24 >> 0x10);
                  iVar29 = 0x33;
                  plVar18 = (long *)((long)plVar18 + 1);
                }
                else {
                  uVar19 = (ulong)uVar24;
                  uVar14 = uVar27;
                  uVar27 = uVar28;
                  if ((uVar24 >> 0xd & 1) == 0) goto LAB_001096cc;
                  uVar17 = (ulong)uVar24;
                }
              }
            }
            else {
LAB_001096cc:
              uVar24 = d->offset_decode_table[(uint)uVar27 & 0xff];
              uVar17 = (ulong)uVar24;
              uVar25 = (uint)uVar26;
              uVar23 = uVar25 & 0xff;
              if ((short)uVar24 < 0) {
                if (uVar23 < 0x26) {
                  uVar27 = uVar27 | *(long *)__src << ((ulong)uVar23 & 0x3f);
                  __src = (ushort *)((long)__src + (7 - (ulong)((uint)(uVar26 >> 3) & 7)));
                  uVar25 = uVar25 | 0x38;
                }
                uVar27 = uVar27 >> 8;
                uVar25 = uVar25 - 8;
                bVar16 = (byte)(uVar24 >> 8) & 0x3f;
                sVar7 = (bVar16 < 0x41) * ('@' - bVar16);
                uVar17 = (ulong)d->offset_decode_table
                                [((uVar27 << sVar7) >> sVar7) + (ulong)(uVar24 >> 0x10)];
              }
              else if (uVar23 < 0x1f) {
                uVar27 = uVar27 | *(long *)__src << ((ulong)uVar23 & 0x3f);
                __src = (ushort *)((long)__src + (7 - (ulong)((uint)(uVar26 >> 3) & 7)));
                uVar25 = uVar25 | 0x38;
              }
              sVar7 = ((byte)uVar17 < 0x41) * ('@' - (byte)uVar17);
              uVar28 = uVar27 << sVar7;
              uVar27 = uVar27 >> (uVar17 & 0x3f);
              uVar25 = uVar25 - (int)uVar17;
              uVar26 = (ulong)uVar25;
              uVar24 = (int)((uVar28 >> sVar7) >> (uVar17 >> 8 & 0x3f)) + (int)(uVar17 >> 0x10);
              uVar28 = (ulong)uVar24;
              if ((long)plVar18 - (long)out < (long)uVar28) {
                iVar29 = 1;
                local_d4 = LIBDEFLATE_BAD_DATA;
              }
              else {
                sVar7 = ((byte)uVar19 < 0x41) * ('@' - (byte)uVar19);
                uVar23 = (int)(((uVar14 << sVar7) >> sVar7) >> (uVar19 >> 8 & 0x3f)) +
                         (int)(uVar19 >> 0x10);
                lVar21 = -uVar28;
                plVar20 = (long *)((ulong)uVar23 + (long)plVar18);
                uVar17 = (ulong)(d->u).litlen_decode_table[uVar27 & uVar15];
                uVar27 = uVar27 | *(long *)__src << (uVar26 & 0x3f);
                __src = (ushort *)((long)__src + (7 - (ulong)(uVar25 >> 3 & 7)));
                uVar26 = (ulong)(uVar25 | 0x38);
                if (uVar24 < 8) {
                  if (uVar24 != 1) {
                    lVar21 = *(long *)((long)plVar18 + lVar21);
                    *plVar18 = lVar21;
                    *(long *)((long)plVar18 + uVar28) = lVar21;
                    do {
                      uVar6 = *(undefined8 *)((long)plVar18 + uVar28);
                      *(undefined8 *)((long)plVar18 + uVar28 * 2) = uVar6;
                      *(undefined8 *)((long)plVar18 + uVar28 * 3) = uVar6;
                      plVar18 = (long *)((long)plVar18 + uVar28 * 2);
                    } while ((long *)((long)plVar18 + uVar28 * 2) < plVar20);
                    goto LAB_00109873;
                  }
                  lVar21 = (ulong)*(byte *)((long)plVar18 + lVar21) * 0x101010101010101;
                  *plVar18 = lVar21;
                  plVar18[1] = lVar21;
                  plVar18[2] = lVar21;
                  plVar18[3] = lVar21;
                  if (0x20 < uVar23) {
                    plVar18 = plVar18 + 4;
                    do {
                      *plVar18 = lVar21;
                      plVar18[1] = lVar21;
                      plVar18[2] = lVar21;
                      plVar18[3] = lVar21;
                      plVar18 = plVar18 + 4;
                    } while (plVar18 < plVar20);
                  }
                }
                else {
                  *plVar18 = *(long *)((long)plVar18 + lVar21);
                  plVar18[1] = *(long *)((long)plVar18 + lVar21 + 8);
                  plVar18[2] = *(long *)((long)plVar18 + lVar21 + 0x10);
                  plVar18[3] = *(long *)((long)plVar18 + lVar21 + 0x18);
                  plVar18[4] = *(long *)((long)plVar18 + lVar21 + 0x20);
                  if (uVar23 < 0x29) {
LAB_00109873:
                    iVar29 = 0;
                    plVar18 = plVar20;
                    goto LAB_00109879;
                  }
                  plVar18 = plVar18 + 5;
                  do {
                    *plVar18 = *(long *)((long)plVar18 + lVar21);
                    plVar18[1] = *(long *)((long)plVar18 + lVar21 + 8);
                    plVar18[2] = *(long *)((long)plVar18 + lVar21 + 0x10);
                    plVar18[3] = *(long *)((long)plVar18 + lVar21 + 0x18);
                    plVar18[4] = *(long *)((long)plVar18 + lVar21 + 0x20);
                    plVar18 = plVar18 + 5;
                  } while (plVar18 < plVar20);
                }
                iVar29 = 0;
                plVar18 = plVar20;
              }
            }
          }
LAB_00109879:
          if ((iVar29 != 0) && (uVar14 = uVar27, lVar22 = local_d4, iVar29 != 0x33))
          goto joined_r0x00109c06;
        } while ((__src < (ushort *)((long)puVar4 - sVar13)) &&
                (uVar14 = uVar27, plVar18 < (long *)((long)plVar3 - sVar12)));
      }
      do {
        uVar24 = (uint)uVar26;
        if ((ulong)((long)puVar4 - (long)__src) < 8) {
          uVar14 = uVar26 & 0xff;
          uVar23 = (uint)uVar14;
          while (uVar17 = uVar27, uVar23 < 0x38) {
            if (__src == puVar4) {
              local_d0 = local_d0 + 1;
              if (8 < local_d0) goto LAB_00109b82;
            }
            else {
              uVar9 = *__src;
              __src = (ushort *)((long)__src + 1);
              uVar27 = uVar27 | (ulong)(byte)uVar9 << (uVar14 & 0x3f);
            }
            uVar24 = (int)uVar26 + 8;
            uVar26 = (ulong)uVar24;
            uVar14 = uVar26 & 0xff;
            uVar23 = (uint)uVar14;
          }
        }
        else {
          lVar21 = *(long *)__src;
          __src = (ushort *)((long)__src + (7 - (ulong)((uint)(uVar26 >> 3) & 7)));
          uVar24 = uVar24 | 0x38;
          uVar17 = uVar27 | lVar21 << (uVar26 & 0x3f);
        }
        uVar23 = (d->u).litlen_decode_table[uVar17 & uVar15];
        uVar14 = (ulong)uVar23;
        uVar27 = uVar17 >> (uVar14 & 0x3f);
        uVar24 = uVar24 - uVar23;
        if ((uVar23 >> 0xe & 1) != 0) {
          bVar16 = (byte)(uVar23 >> 8) & 0x3f;
          sVar7 = (bVar16 < 0x41) * ('@' - bVar16);
          uVar14 = (ulong)(d->u).litlen_decode_table
                          [((uVar27 << sVar7) >> sVar7) + (ulong)(uVar23 >> 0x10)];
          uVar24 = uVar24 - (d->u).litlen_decode_table
                            [((uVar27 << sVar7) >> sVar7) + (ulong)(uVar23 >> 0x10)];
          uVar17 = uVar27;
          uVar27 = uVar27 >> (uVar14 & 0x3f);
        }
        uVar26 = (ulong)uVar24;
        if ((int)(uint)uVar14 < 0) {
          if (plVar18 == plVar3) {
LAB_00109bb6:
            local_d4 = LIBDEFLATE_INSUFFICIENT_SPACE;
            iVar29 = 1;
          }
          else {
            *(char *)plVar18 = (char)(uVar14 >> 0x10);
            plVar18 = (long *)((long)plVar18 + 1);
            iVar29 = 0x4f;
          }
        }
        else if (((uint)uVar14 >> 0xd & 1) == 0) {
          sVar7 = ((byte)uVar14 < 0x41) * ('@' - (byte)uVar14);
          uVar14 = (ulong)(uint)((int)(uVar14 >> 0x10) +
                                (int)(((uVar17 << sVar7) >> sVar7) >>
                                     ((ulong)((byte)(uVar14 >> 8) & 0xdf) & 0x3f)));
          if ((long)plVar3 - (long)plVar18 < (long)uVar14) goto LAB_00109bb6;
          uVar23 = d->offset_decode_table[uVar27 & 0xff];
          if ((short)uVar23 < 0) {
            uVar27 = uVar27 >> 8;
            uVar24 = uVar24 - 8;
            bVar16 = (byte)(uVar23 >> 8) & 0x3f;
            sVar7 = (bVar16 < 0x41) * ('@' - bVar16);
            uVar23 = d->offset_decode_table[((uVar27 << sVar7) >> sVar7) + (ulong)(uVar23 >> 0x10)];
          }
          sVar7 = ((byte)uVar23 < 0x41) * ('@' - (byte)uVar23);
          uVar26 = (ulong)(uVar24 - uVar23);
          uVar17 = (ulong)((int)(((uVar27 << sVar7) >> sVar7) >> ((ulong)(uVar23 >> 8) & 0x3f)) +
                          (uVar23 >> 0x10));
          uVar27 = uVar27 >> ((ulong)uVar23 & 0x3f);
          if ((long)plVar18 - (long)out < (long)uVar17) {
LAB_00109b82:
            iVar29 = 1;
            local_d4 = LIBDEFLATE_BAD_DATA;
          }
          else {
            plVar20 = (long *)(uVar14 + (long)plVar18);
            *(undefined1 *)plVar18 = *(undefined1 *)((long)plVar18 - uVar17);
            *(undefined1 *)((long)plVar18 + 1) = ((undefined1 *)((long)plVar18 - uVar17))[1];
            plVar18 = (long *)((long)plVar18 + 2);
            do {
              *(undefined1 *)plVar18 = *(undefined1 *)((long)plVar18 - uVar17);
              plVar18 = (long *)((long)plVar18 + 1);
            } while (plVar18 < plVar20);
            iVar29 = 0;
            plVar18 = plVar20;
          }
        }
        else {
          iVar29 = 0x1c;
        }
      } while ((iVar29 == 0) || (uVar14 = uVar27, lVar22 = local_d4, iVar29 == 0x4f));
joined_r0x00109c06:
      if (iVar29 != 0x1c) {
        return lVar22;
      }
    }
    local_d4 = lVar22;
  } while ((local_b0 & 1) == 0);
  uVar14 = (ulong)((uint)(uVar26 >> 3) & 0x1f);
  lVar21 = local_d0 - uVar14;
  if (local_d0 < uVar14 || lVar21 == 0) {
    if (actual_in_nbytes_ret != (size_t *)0x0) {
      *actual_in_nbytes_ret = (size_t)((long)__src + (lVar21 - (long)in));
    }
    if (actual_out_nbytes_ret == (size_t *)0x0) {
      if (plVar18 != plVar3) {
        return LIBDEFLATE_SHORT_OUTPUT;
      }
    }
    else {
      *actual_out_nbytes_ret = (long)plVar18 - (long)out;
    }
    lVar22 = LIBDEFLATE_SUCCESS;
  }
  else {
LAB_00109d38:
    lVar22 = LIBDEFLATE_BAD_DATA;
  }
  return lVar22;
}

Assistant:

static ATTRIBUTES MAYBE_UNUSED enum libdeflate_result
FUNCNAME(struct libdeflate_decompressor * restrict d,
	 const void * restrict in, size_t in_nbytes,
	 void * restrict out, size_t out_nbytes_avail,
	 size_t *actual_in_nbytes_ret, size_t *actual_out_nbytes_ret)
{
	u8 *out_next = out;
	u8 * const out_end = out_next + out_nbytes_avail;
	u8 * const out_fastloop_end =
		out_end - MIN(out_nbytes_avail, FASTLOOP_MAX_BYTES_WRITTEN);

	/* Input bitstream state; see deflate_decompress.c for documentation */
	const u8 *in_next = in;
	const u8 * const in_end = in_next + in_nbytes;
	const u8 * const in_fastloop_end =
		in_end - MIN(in_nbytes, FASTLOOP_MAX_BYTES_READ);
	bitbuf_t bitbuf = 0;
	bitbuf_t saved_bitbuf;
	u32 bitsleft = 0;
	size_t overread_count = 0;

	bool is_final_block;
	unsigned block_type;
	unsigned num_litlen_syms;
	unsigned num_offset_syms;
	bitbuf_t litlen_tablemask;
	u32 entry;

next_block:
	/* Starting to read the next block */
	;

	STATIC_ASSERT(CAN_CONSUME(1 + 2 + 5 + 5 + 4 + 3));
	REFILL_BITS();

	/* BFINAL: 1 bit */
	is_final_block = bitbuf & BITMASK(1);

	/* BTYPE: 2 bits */
	block_type = (bitbuf >> 1) & BITMASK(2);

	if (block_type == DEFLATE_BLOCKTYPE_DYNAMIC_HUFFMAN) {

		/* Dynamic Huffman block */

		/* The order in which precode lengths are stored */
		static const u8 deflate_precode_lens_permutation[DEFLATE_NUM_PRECODE_SYMS] = {
			16, 17, 18, 0, 8, 7, 9, 6, 10, 5, 11, 4, 12, 3, 13, 2, 14, 1, 15
		};

		unsigned num_explicit_precode_lens;
		unsigned i;

		/* Read the codeword length counts. */

		STATIC_ASSERT(DEFLATE_NUM_LITLEN_SYMS == 257 + BITMASK(5));
		num_litlen_syms = 257 + ((bitbuf >> 3) & BITMASK(5));

		STATIC_ASSERT(DEFLATE_NUM_OFFSET_SYMS == 1 + BITMASK(5));
		num_offset_syms = 1 + ((bitbuf >> 8) & BITMASK(5));

		STATIC_ASSERT(DEFLATE_NUM_PRECODE_SYMS == 4 + BITMASK(4));
		num_explicit_precode_lens = 4 + ((bitbuf >> 13) & BITMASK(4));

		d->static_codes_loaded = false;

		/*
		 * Read the precode codeword lengths.
		 *
		 * A 64-bit bitbuffer is just one bit too small to hold the
		 * maximum number of precode lens, so to minimize branches we
		 * merge one len with the previous fields.
		 */
		STATIC_ASSERT(DEFLATE_MAX_PRE_CODEWORD_LEN == (1 << 3) - 1);
		if (CAN_CONSUME(3 * (DEFLATE_NUM_PRECODE_SYMS - 1))) {
			d->u.precode_lens[deflate_precode_lens_permutation[0]] =
				(bitbuf >> 17) & BITMASK(3);
			bitbuf >>= 20;
			bitsleft -= 20;
			REFILL_BITS();
			i = 1;
			do {
				d->u.precode_lens[deflate_precode_lens_permutation[i]] =
					bitbuf & BITMASK(3);
				bitbuf >>= 3;
				bitsleft -= 3;
			} while (++i < num_explicit_precode_lens);
		} else {
			bitbuf >>= 17;
			bitsleft -= 17;
			i = 0;
			do {
				if ((u8)bitsleft < 3)
					REFILL_BITS();
				d->u.precode_lens[deflate_precode_lens_permutation[i]] =
					bitbuf & BITMASK(3);
				bitbuf >>= 3;
				bitsleft -= 3;
			} while (++i < num_explicit_precode_lens);
		}
		for (; i < DEFLATE_NUM_PRECODE_SYMS; i++)
			d->u.precode_lens[deflate_precode_lens_permutation[i]] = 0;

		/* Build the decode table for the precode. */
		SAFETY_CHECK(build_precode_decode_table(d));

		/* Decode the litlen and offset codeword lengths. */
		i = 0;
		do {
			unsigned presym;
			u8 rep_val;
			unsigned rep_count;

			if ((u8)bitsleft < DEFLATE_MAX_PRE_CODEWORD_LEN + 7)
				REFILL_BITS();

			/*
			 * The code below assumes that the precode decode table
			 * doesn't have any subtables.
			 */
			STATIC_ASSERT(PRECODE_TABLEBITS == DEFLATE_MAX_PRE_CODEWORD_LEN);

			/* Decode the next precode symbol. */
			entry = d->u.l.precode_decode_table[
				bitbuf & BITMASK(DEFLATE_MAX_PRE_CODEWORD_LEN)];
			bitbuf >>= (u8)entry;
			bitsleft -= entry; /* optimization: subtract full entry */
			presym = entry >> 16;

			if (presym < 16) {
				/* Explicit codeword length */
				d->u.l.lens[i++] = presym;
				continue;
			}

			/* Run-length encoded codeword lengths */

			/*
			 * Note: we don't need to immediately verify that the
			 * repeat count doesn't overflow the number of elements,
			 * since we've sized the lens array to have enough extra
			 * space to allow for the worst-case overrun (138 zeroes
			 * when only 1 length was remaining).
			 *
			 * In the case of the small repeat counts (presyms 16
			 * and 17), it is fastest to always write the maximum
			 * number of entries.  That gets rid of branches that
			 * would otherwise be required.
			 *
			 * It is not just because of the numerical order that
			 * our checks go in the order 'presym < 16', 'presym ==
			 * 16', and 'presym == 17'.  For typical data this is
			 * ordered from most frequent to least frequent case.
			 */
			STATIC_ASSERT(DEFLATE_MAX_LENS_OVERRUN == 138 - 1);

			if (presym == 16) {
				/* Repeat the previous length 3 - 6 times. */
				SAFETY_CHECK(i != 0);
				rep_val = d->u.l.lens[i - 1];
				STATIC_ASSERT(3 + BITMASK(2) == 6);
				rep_count = 3 + (bitbuf & BITMASK(2));
				bitbuf >>= 2;
				bitsleft -= 2;
				d->u.l.lens[i + 0] = rep_val;
				d->u.l.lens[i + 1] = rep_val;
				d->u.l.lens[i + 2] = rep_val;
				d->u.l.lens[i + 3] = rep_val;
				d->u.l.lens[i + 4] = rep_val;
				d->u.l.lens[i + 5] = rep_val;
				i += rep_count;
			} else if (presym == 17) {
				/* Repeat zero 3 - 10 times. */
				STATIC_ASSERT(3 + BITMASK(3) == 10);
				rep_count = 3 + (bitbuf & BITMASK(3));
				bitbuf >>= 3;
				bitsleft -= 3;
				d->u.l.lens[i + 0] = 0;
				d->u.l.lens[i + 1] = 0;
				d->u.l.lens[i + 2] = 0;
				d->u.l.lens[i + 3] = 0;
				d->u.l.lens[i + 4] = 0;
				d->u.l.lens[i + 5] = 0;
				d->u.l.lens[i + 6] = 0;
				d->u.l.lens[i + 7] = 0;
				d->u.l.lens[i + 8] = 0;
				d->u.l.lens[i + 9] = 0;
				i += rep_count;
			} else {
				/* Repeat zero 11 - 138 times. */
				STATIC_ASSERT(11 + BITMASK(7) == 138);
				rep_count = 11 + (bitbuf & BITMASK(7));
				bitbuf >>= 7;
				bitsleft -= 7;
				memset(&d->u.l.lens[i], 0,
				       rep_count * sizeof(d->u.l.lens[i]));
				i += rep_count;
			}
		} while (i < num_litlen_syms + num_offset_syms);

		/* Unnecessary, but check this for consistency with zlib. */
		SAFETY_CHECK(i == num_litlen_syms + num_offset_syms);

	} else if (block_type == DEFLATE_BLOCKTYPE_UNCOMPRESSED) {
		u16 len, nlen;

		/*
		 * Uncompressed block: copy 'len' bytes literally from the input
		 * buffer to the output buffer.
		 */

		bitsleft -= 3; /* for BTYPE and BFINAL */

		/*
		 * Align the bitstream to the next byte boundary.  This means
		 * the next byte boundary as if we were reading a byte at a
		 * time.  Therefore, we have to rewind 'in_next' by any bytes
		 * that have been refilled but not actually consumed yet (not
		 * counting overread bytes, which don't increment 'in_next').
		 */
		bitsleft = (u8)bitsleft;
		SAFETY_CHECK(overread_count <= (bitsleft >> 3));
		in_next -= (bitsleft >> 3) - overread_count;
		overread_count = 0;
		bitbuf = 0;
		bitsleft = 0;

		SAFETY_CHECK(in_end - in_next >= 4);
		len = get_unaligned_le16(in_next);
		nlen = get_unaligned_le16(in_next + 2);
		in_next += 4;

		SAFETY_CHECK(len == (u16)~nlen);
		if (unlikely(len > out_end - out_next))
			return LIBDEFLATE_INSUFFICIENT_SPACE;
		SAFETY_CHECK(len <= in_end - in_next);

		memcpy(out_next, in_next, len);
		in_next += len;
		out_next += len;

		goto block_done;

	} else {
		unsigned i;

		SAFETY_CHECK(block_type == DEFLATE_BLOCKTYPE_STATIC_HUFFMAN);

		/*
		 * Static Huffman block: build the decode tables for the static
		 * codes.  Skip doing so if the tables are already set up from
		 * an earlier static block; this speeds up decompression of
		 * degenerate input of many empty or very short static blocks.
		 *
		 * Afterwards, the remainder is the same as decompressing a
		 * dynamic Huffman block.
		 */

		bitbuf >>= 3; /* for BTYPE and BFINAL */
		bitsleft -= 3;

		if (d->static_codes_loaded)
			goto have_decode_tables;

		d->static_codes_loaded = true;

		STATIC_ASSERT(DEFLATE_NUM_LITLEN_SYMS == 288);
		STATIC_ASSERT(DEFLATE_NUM_OFFSET_SYMS == 32);

		for (i = 0; i < 144; i++)
			d->u.l.lens[i] = 8;
		for (; i < 256; i++)
			d->u.l.lens[i] = 9;
		for (; i < 280; i++)
			d->u.l.lens[i] = 7;
		for (; i < 288; i++)
			d->u.l.lens[i] = 8;

		for (; i < 288 + 32; i++)
			d->u.l.lens[i] = 5;

		num_litlen_syms = 288;
		num_offset_syms = 32;
	}

	/* Decompressing a Huffman block (either dynamic or static) */

	SAFETY_CHECK(build_offset_decode_table(d, num_litlen_syms, num_offset_syms));
	SAFETY_CHECK(build_litlen_decode_table(d, num_litlen_syms, num_offset_syms));
have_decode_tables:
	litlen_tablemask = BITMASK(d->litlen_tablebits);

	/*
	 * This is the "fastloop" for decoding literals and matches.  It does
	 * bounds checks on in_next and out_next in the loop conditions so that
	 * additional bounds checks aren't needed inside the loop body.
	 *
	 * To reduce latency, the bitbuffer is refilled and the next litlen
	 * decode table entry is preloaded before each loop iteration.
	 */
	if (in_next >= in_fastloop_end || out_next >= out_fastloop_end)
		goto generic_loop;
	REFILL_BITS_IN_FASTLOOP();
	entry = d->u.litlen_decode_table[bitbuf & litlen_tablemask];
	do {
		u32 length, offset, lit;
		const u8 *src;
		u8 *dst;

		/*
		 * Consume the bits for the litlen decode table entry.  Save the
		 * original bitbuf for later, in case the extra match length
		 * bits need to be extracted from it.
		 */
		saved_bitbuf = bitbuf;
		bitbuf >>= (u8)entry;
		bitsleft -= entry; /* optimization: subtract full entry */

		/*
		 * Begin by checking for a "fast" literal, i.e. a literal that
		 * doesn't need a subtable.
		 */
		if (entry & HUFFDEC_LITERAL) {
			/*
			 * On 64-bit platforms, we decode up to 2 extra fast
			 * literals in addition to the primary item, as this
			 * increases performance and still leaves enough bits
			 * remaining for what follows.  We could actually do 3,
			 * assuming LITLEN_TABLEBITS=11, but that actually
			 * decreases performance slightly (perhaps by messing
			 * with the branch prediction of the conditional refill
			 * that happens later while decoding the match offset).
			 *
			 * Note: the definitions of FASTLOOP_MAX_BYTES_WRITTEN
			 * and FASTLOOP_MAX_BYTES_READ need to be updated if the
			 * number of extra literals decoded here is changed.
			 */
			if (/* enough bits for 2 fast literals + length + offset preload? */
			    CAN_CONSUME_AND_THEN_PRELOAD(2 * LITLEN_TABLEBITS +
							 LENGTH_MAXBITS,
							 OFFSET_TABLEBITS) &&
			    /* enough bits for 2 fast literals + slow literal + litlen preload? */
			    CAN_CONSUME_AND_THEN_PRELOAD(2 * LITLEN_TABLEBITS +
							 DEFLATE_MAX_LITLEN_CODEWORD_LEN,
							 LITLEN_TABLEBITS)) {
				/* 1st extra fast literal */
				lit = entry >> 16;
				entry = d->u.litlen_decode_table[bitbuf & litlen_tablemask];
				saved_bitbuf = bitbuf;
				bitbuf >>= (u8)entry;
				bitsleft -= entry;
				*out_next++ = lit;
				if (entry & HUFFDEC_LITERAL) {
					/* 2nd extra fast literal */
					lit = entry >> 16;
					entry = d->u.litlen_decode_table[bitbuf & litlen_tablemask];
					saved_bitbuf = bitbuf;
					bitbuf >>= (u8)entry;
					bitsleft -= entry;
					*out_next++ = lit;
					if (entry & HUFFDEC_LITERAL) {
						/*
						 * Another fast literal, but
						 * this one is in lieu of the
						 * primary item, so it doesn't
						 * count as one of the extras.
						 */
						lit = entry >> 16;
						entry = d->u.litlen_decode_table[bitbuf & litlen_tablemask];
						REFILL_BITS_IN_FASTLOOP();
						*out_next++ = lit;
						continue;
					}
				}
			} else {
				/*
				 * Decode a literal.  While doing so, preload
				 * the next litlen decode table entry and refill
				 * the bitbuffer.  To reduce latency, we've
				 * arranged for there to be enough "preloadable"
				 * bits remaining to do the table preload
				 * independently of the refill.
				 */
				STATIC_ASSERT(CAN_CONSUME_AND_THEN_PRELOAD(
						LITLEN_TABLEBITS, LITLEN_TABLEBITS));
				lit = entry >> 16;
				entry = d->u.litlen_decode_table[bitbuf & litlen_tablemask];
				REFILL_BITS_IN_FASTLOOP();
				*out_next++ = lit;
				continue;
			}
		}

		/*
		 * It's not a literal entry, so it can be a length entry, a
		 * subtable pointer entry, or an end-of-block entry.  Detect the
		 * two unlikely cases by testing the HUFFDEC_EXCEPTIONAL flag.
		 */
		if (unlikely(entry & HUFFDEC_EXCEPTIONAL)) {
			/* Subtable pointer or end-of-block entry */

			if (unlikely(entry & HUFFDEC_END_OF_BLOCK))
				goto block_done;

			/*
			 * A subtable is required.  Load and consume the
			 * subtable entry.  The subtable entry can be of any
			 * type: literal, length, or end-of-block.
			 */
			entry = d->u.litlen_decode_table[(entry >> 16) +
				EXTRACT_VARBITS(bitbuf, (entry >> 8) & 0x3F)];
			saved_bitbuf = bitbuf;
			bitbuf >>= (u8)entry;
			bitsleft -= entry;

			/*
			 * 32-bit platforms that use the byte-at-a-time refill
			 * method have to do a refill here for there to always
			 * be enough bits to decode a literal that requires a
			 * subtable, then preload the next litlen decode table
			 * entry; or to decode a match length that requires a
			 * subtable, then preload the offset decode table entry.
			 */
			if (!CAN_CONSUME_AND_THEN_PRELOAD(DEFLATE_MAX_LITLEN_CODEWORD_LEN,
							  LITLEN_TABLEBITS) ||
			    !CAN_CONSUME_AND_THEN_PRELOAD(LENGTH_MAXBITS,
							  OFFSET_TABLEBITS))
				REFILL_BITS_IN_FASTLOOP();
			if (entry & HUFFDEC_LITERAL) {
				/* Decode a literal that required a subtable. */
				lit = entry >> 16;
				entry = d->u.litlen_decode_table[bitbuf & litlen_tablemask];
				REFILL_BITS_IN_FASTLOOP();
				*out_next++ = lit;
				continue;
			}
			if (unlikely(entry & HUFFDEC_END_OF_BLOCK))
				goto block_done;
			/* Else, it's a length that required a subtable. */
		}

		/*
		 * Decode the match length: the length base value associated
		 * with the litlen symbol (which we extract from the decode
		 * table entry), plus the extra length bits.  We don't need to
		 * consume the extra length bits here, as they were included in
		 * the bits consumed by the entry earlier.  We also don't need
		 * to check for too-long matches here, as this is inside the
		 * fastloop where it's already been verified that the output
		 * buffer has enough space remaining to copy a max-length match.
		 */
		length = entry >> 16;
		length += EXTRACT_VARBITS8(saved_bitbuf, entry) >> (u8)(entry >> 8);

		/*
		 * Decode the match offset.  There are enough "preloadable" bits
		 * remaining to preload the offset decode table entry, but a
		 * refill might be needed before consuming it.
		 */
		STATIC_ASSERT(CAN_CONSUME_AND_THEN_PRELOAD(LENGTH_MAXFASTBITS,
							   OFFSET_TABLEBITS));
		entry = d->offset_decode_table[bitbuf & BITMASK(OFFSET_TABLEBITS)];
		if (CAN_CONSUME_AND_THEN_PRELOAD(OFFSET_MAXBITS,
						 LITLEN_TABLEBITS)) {
			/*
			 * Decoding a match offset on a 64-bit platform.  We may
			 * need to refill once, but then we can decode the whole
			 * offset and preload the next litlen table entry.
			 */
			if (unlikely(entry & HUFFDEC_EXCEPTIONAL)) {
				/* Offset codeword requires a subtable */
				if (unlikely((u8)bitsleft < OFFSET_MAXBITS +
					     LITLEN_TABLEBITS - PRELOAD_SLACK))
					REFILL_BITS_IN_FASTLOOP();
				bitbuf >>= OFFSET_TABLEBITS;
				bitsleft -= OFFSET_TABLEBITS;
				entry = d->offset_decode_table[(entry >> 16) +
					EXTRACT_VARBITS(bitbuf, (entry >> 8) & 0x3F)];
			} else if (unlikely((u8)bitsleft < OFFSET_MAXFASTBITS +
					    LITLEN_TABLEBITS - PRELOAD_SLACK))
				REFILL_BITS_IN_FASTLOOP();
		} else {
			/* Decoding a match offset on a 32-bit platform */
			REFILL_BITS_IN_FASTLOOP();
			if (unlikely(entry & HUFFDEC_EXCEPTIONAL)) {
				/* Offset codeword requires a subtable */
				bitbuf >>= OFFSET_TABLEBITS;
				bitsleft -= OFFSET_TABLEBITS;
				entry = d->offset_decode_table[(entry >> 16) +
					EXTRACT_VARBITS(bitbuf, (entry >> 8) & 0x3F)];
				REFILL_BITS_IN_FASTLOOP();
				/* No further refill needed before extra bits */
				STATIC_ASSERT(CAN_CONSUME(
					OFFSET_MAXBITS - OFFSET_TABLEBITS));
			} else {
				/* No refill needed before extra bits */
				STATIC_ASSERT(CAN_CONSUME(OFFSET_MAXFASTBITS));
			}
		}
		saved_bitbuf = bitbuf;
		bitbuf >>= (u8)entry;
		bitsleft -= entry; /* optimization: subtract full entry */
		offset = entry >> 16;
		offset += EXTRACT_VARBITS8(saved_bitbuf, entry) >> (u8)(entry >> 8);

		/* Validate the match offset; needed even in the fastloop. */
		SAFETY_CHECK(offset <= out_next - (const u8 *)out);
		src = out_next - offset;
		dst = out_next;
		out_next += length;

		/*
		 * Before starting to issue the instructions to copy the match,
		 * refill the bitbuffer and preload the litlen decode table
		 * entry for the next loop iteration.  This can increase
		 * performance by allowing the latency of the match copy to
		 * overlap with these other operations.  To further reduce
		 * latency, we've arranged for there to be enough bits remaining
		 * to do the table preload independently of the refill, except
		 * on 32-bit platforms using the byte-at-a-time refill method.
		 */
		if (!CAN_CONSUME_AND_THEN_PRELOAD(
			MAX(OFFSET_MAXBITS - OFFSET_TABLEBITS,
			    OFFSET_MAXFASTBITS),
			LITLEN_TABLEBITS) &&
		    unlikely((u8)bitsleft < LITLEN_TABLEBITS - PRELOAD_SLACK))
			REFILL_BITS_IN_FASTLOOP();
		entry = d->u.litlen_decode_table[bitbuf & litlen_tablemask];
		REFILL_BITS_IN_FASTLOOP();

		/*
		 * Copy the match.  On most CPUs the fastest method is a
		 * word-at-a-time copy, unconditionally copying about 5 words
		 * since this is enough for most matches without being too much.
		 *
		 * The normal word-at-a-time copy works for offset >= WORDBYTES,
		 * which is most cases.  The case of offset == 1 is also common
		 * and is worth optimizing for, since it is just RLE encoding of
		 * the previous byte, which is the result of compressing long
		 * runs of the same byte.
		 *
		 * Writing past the match 'length' is allowed here, since it's
		 * been ensured there is enough output space left for a slight
		 * overrun.  FASTLOOP_MAX_BYTES_WRITTEN needs to be updated if
		 * the maximum possible overrun here is changed.
		 */
		if (UNALIGNED_ACCESS_IS_FAST && offset >= WORDBYTES) {
			store_word_unaligned(load_word_unaligned(src), dst);
			src += WORDBYTES;
			dst += WORDBYTES;
			store_word_unaligned(load_word_unaligned(src), dst);
			src += WORDBYTES;
			dst += WORDBYTES;
			store_word_unaligned(load_word_unaligned(src), dst);
			src += WORDBYTES;
			dst += WORDBYTES;
			store_word_unaligned(load_word_unaligned(src), dst);
			src += WORDBYTES;
			dst += WORDBYTES;
			store_word_unaligned(load_word_unaligned(src), dst);
			src += WORDBYTES;
			dst += WORDBYTES;
			while (dst < out_next) {
				store_word_unaligned(load_word_unaligned(src), dst);
				src += WORDBYTES;
				dst += WORDBYTES;
				store_word_unaligned(load_word_unaligned(src), dst);
				src += WORDBYTES;
				dst += WORDBYTES;
				store_word_unaligned(load_word_unaligned(src), dst);
				src += WORDBYTES;
				dst += WORDBYTES;
				store_word_unaligned(load_word_unaligned(src), dst);
				src += WORDBYTES;
				dst += WORDBYTES;
				store_word_unaligned(load_word_unaligned(src), dst);
				src += WORDBYTES;
				dst += WORDBYTES;
			}
		} else if (UNALIGNED_ACCESS_IS_FAST && offset == 1) {
			machine_word_t v;

			/*
			 * This part tends to get auto-vectorized, so keep it
			 * copying a multiple of 16 bytes at a time.
			 */
			v = (machine_word_t)0x0101010101010101 * src[0];
			store_word_unaligned(v, dst);
			dst += WORDBYTES;
			store_word_unaligned(v, dst);
			dst += WORDBYTES;
			store_word_unaligned(v, dst);
			dst += WORDBYTES;
			store_word_unaligned(v, dst);
			dst += WORDBYTES;
			while (dst < out_next) {
				store_word_unaligned(v, dst);
				dst += WORDBYTES;
				store_word_unaligned(v, dst);
				dst += WORDBYTES;
				store_word_unaligned(v, dst);
				dst += WORDBYTES;
				store_word_unaligned(v, dst);
				dst += WORDBYTES;
			}
		} else if (UNALIGNED_ACCESS_IS_FAST) {
			store_word_unaligned(load_word_unaligned(src), dst);
			src += offset;
			dst += offset;
			store_word_unaligned(load_word_unaligned(src), dst);
			src += offset;
			dst += offset;
			do {
				store_word_unaligned(load_word_unaligned(src), dst);
				src += offset;
				dst += offset;
				store_word_unaligned(load_word_unaligned(src), dst);
				src += offset;
				dst += offset;
			} while (dst < out_next);
		} else {
			*dst++ = *src++;
			*dst++ = *src++;
			do {
				*dst++ = *src++;
			} while (dst < out_next);
		}
	} while (in_next < in_fastloop_end && out_next < out_fastloop_end);

	/*
	 * This is the generic loop for decoding literals and matches.  This
	 * handles cases where in_next and out_next are close to the end of
	 * their respective buffers.  Usually this loop isn't performance-
	 * critical, as most time is spent in the fastloop above instead.  We
	 * therefore omit some optimizations here in favor of smaller code.
	 */
generic_loop:
	for (;;) {
		u32 length, offset;
		const u8 *src;
		u8 *dst;

		REFILL_BITS();
		entry = d->u.litlen_decode_table[bitbuf & litlen_tablemask];
		saved_bitbuf = bitbuf;
		bitbuf >>= (u8)entry;
		bitsleft -= entry;
		if (unlikely(entry & HUFFDEC_SUBTABLE_POINTER)) {
			entry = d->u.litlen_decode_table[(entry >> 16) +
					EXTRACT_VARBITS(bitbuf, (entry >> 8) & 0x3F)];
			saved_bitbuf = bitbuf;
			bitbuf >>= (u8)entry;
			bitsleft -= entry;
		}
		length = entry >> 16;
		if (entry & HUFFDEC_LITERAL) {
			if (unlikely(out_next == out_end))
				return LIBDEFLATE_INSUFFICIENT_SPACE;
			*out_next++ = length;
			continue;
		}
		if (unlikely(entry & HUFFDEC_END_OF_BLOCK))
			goto block_done;
		length += EXTRACT_VARBITS8(saved_bitbuf, entry) >> (u8)(entry >> 8);
		if (unlikely(length > out_end - out_next))
			return LIBDEFLATE_INSUFFICIENT_SPACE;

		if (!CAN_CONSUME(LENGTH_MAXBITS + OFFSET_MAXBITS))
			REFILL_BITS();
		entry = d->offset_decode_table[bitbuf & BITMASK(OFFSET_TABLEBITS)];
		if (unlikely(entry & HUFFDEC_EXCEPTIONAL)) {
			bitbuf >>= OFFSET_TABLEBITS;
			bitsleft -= OFFSET_TABLEBITS;
			entry = d->offset_decode_table[(entry >> 16) +
					EXTRACT_VARBITS(bitbuf, (entry >> 8) & 0x3F)];
			if (!CAN_CONSUME(OFFSET_MAXBITS))
				REFILL_BITS();
		}
		offset = entry >> 16;
		offset += EXTRACT_VARBITS8(bitbuf, entry) >> (u8)(entry >> 8);
		bitbuf >>= (u8)entry;
		bitsleft -= entry;

		SAFETY_CHECK(offset <= out_next - (const u8 *)out);
		src = out_next - offset;
		dst = out_next;
		out_next += length;

		STATIC_ASSERT(DEFLATE_MIN_MATCH_LEN == 3);
		*dst++ = *src++;
		*dst++ = *src++;
		do {
			*dst++ = *src++;
		} while (dst < out_next);
	}

block_done:
	/* Finished decoding a block */

	if (!is_final_block)
		goto next_block;

	/* That was the last block. */

	bitsleft = (u8)bitsleft;

	/*
	 * If any of the implicit appended zero bytes were consumed (not just
	 * refilled) before hitting end of stream, then the data is bad.
	 */
	SAFETY_CHECK(overread_count <= (bitsleft >> 3));

	/* Optionally return the actual number of bytes consumed. */
	if (actual_in_nbytes_ret) {
		/* Don't count bytes that were refilled but not consumed. */
		in_next -= (bitsleft >> 3) - overread_count;

		*actual_in_nbytes_ret = in_next - (u8 *)in;
	}

	/* Optionally return the actual number of bytes written. */
	if (actual_out_nbytes_ret) {
		*actual_out_nbytes_ret = out_next - (u8 *)out;
	} else {
		if (out_next != out_end)
			return LIBDEFLATE_SHORT_OUTPUT;
	}
	return LIBDEFLATE_SUCCESS;
}